

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O0

int WebPPictureCrop(WebPPicture *pic,int left,int top,int width,int height)

{
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  WebPPicture *in_RDI;
  undefined4 in_R8D;
  uint8_t *src;
  int a_offset;
  int uv_offset;
  int y_offset;
  WebPPicture tmp;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  WebPPicture *in_stack_fffffffffffffec8;
  int src_stride;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined1 local_120 [8];
  undefined4 local_118;
  undefined4 local_114;
  long local_f0;
  WebPEncodingError local_98;
  undefined4 local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  WebPPicture *local_10;
  int local_4;
  
  if (in_RDI == (WebPPicture *)0x0) {
    local_4 = 0;
  }
  else {
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar1 = AdjustAndCheckRectangle
                      (in_stack_fffffffffffffec8,
                       (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0,
                       0x15a723);
    src_stride = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      PictureGrabSpecs((WebPPicture *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (WebPPicture *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))
      ;
      local_118 = local_1c;
      local_114 = local_20;
      iVar1 = WebPPictureAlloc((WebPPicture *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (iVar1 == 0) {
        local_4 = WebPEncodingSetError(local_10,local_98);
      }
      else {
        if (local_10->use_argb == 0) {
          iVar1 = (local_18 / 2) * local_10->uv_stride;
          WebPCopyPlane((uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        src_stride,(uint8_t *)CONCAT44(iVar1,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
          WebPCopyPlane((uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        src_stride,(uint8_t *)CONCAT44(iVar1,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
          WebPCopyPlane((uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        src_stride,(uint8_t *)CONCAT44(iVar1,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
          if (local_f0 != 0) {
            WebPCopyPlane((uint8_t *)
                          CONCAT44(local_18 * local_10->a_stride + local_14,
                                   in_stack_fffffffffffffed0),src_stride,
                          (uint8_t *)CONCAT44(iVar1,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
          }
        }
        else {
          WebPCopyPlane((uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (int)((ulong)(local_10->argb +
                                     (long)(local_18 * local_10->argb_stride) + (long)local_14) >>
                             0x20),
                        (uint8_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
        }
        WebPPictureFree((WebPPicture *)0x15a9b2);
        memcpy(local_10,local_120,0x100);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int WebPPictureCrop(WebPPicture* pic,
                    int left, int top, int width, int height) {
  WebPPicture tmp;

  if (pic == NULL) return 0;
  if (!AdjustAndCheckRectangle(pic, &left, &top, width, height)) return 0;

  PictureGrabSpecs(pic, &tmp);
  tmp.width = width;
  tmp.height = height;
  if (!WebPPictureAlloc(&tmp)) {
    return WebPEncodingSetError(pic, tmp.error_code);
  }

  if (!pic->use_argb) {
    const int y_offset = top * pic->y_stride + left;
    const int uv_offset = (top / 2) * pic->uv_stride + left / 2;
    WebPCopyPlane(pic->y + y_offset, pic->y_stride,
                  tmp.y, tmp.y_stride, width, height);
    WebPCopyPlane(pic->u + uv_offset, pic->uv_stride,
                  tmp.u, tmp.uv_stride, HALVE(width), HALVE(height));
    WebPCopyPlane(pic->v + uv_offset, pic->uv_stride,
                  tmp.v, tmp.uv_stride, HALVE(width), HALVE(height));

    if (tmp.a != NULL) {
      const int a_offset = top * pic->a_stride + left;
      WebPCopyPlane(pic->a + a_offset, pic->a_stride,
                    tmp.a, tmp.a_stride, width, height);
    }
  } else {
    const uint8_t* const src =
        (const uint8_t*)(pic->argb + top * pic->argb_stride + left);
    WebPCopyPlane(src, pic->argb_stride * 4, (uint8_t*)tmp.argb,
                  tmp.argb_stride * 4, width * 4, height);
  }
  WebPPictureFree(pic);
  *pic = tmp;
  return 1;
}